

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Appearance_PDU::SetEntityType(Appearance_PDU *this,EntityType *Type)

{
  KUINT16 *pKVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  
  if (((this->m_AppearanceFlag1Union).m_ui8Flag & 2) == 0) {
    (this->m_AppearanceFlag1Union).m_ui8Flag = (this->m_AppearanceFlag1Union).m_ui8Flag | 2;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 8;
  }
  KVar2 = Type->m_ui8Domain;
  KVar3 = Type->m_ui16Country;
  KVar4 = Type->m_ui8Category;
  KVar5 = Type->m_ui8SubCategory;
  KVar6 = Type->m_ui8Specific;
  KVar7 = Type->m_ui8Extra;
  (this->m_EntityType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_EntityType).m_ui8Domain = KVar2;
  (this->m_EntityType).m_ui16Country = KVar3;
  (this->m_EntityType).m_ui8Category = KVar4;
  (this->m_EntityType).m_ui8SubCategory = KVar5;
  (this->m_EntityType).m_ui8Specific = KVar6;
  (this->m_EntityType).m_ui8Extra = KVar7;
  return;
}

Assistant:

void Appearance_PDU::SetEntityTypeFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8Typ )return;

    m_AppearanceFlag1Union.m_ui8Typ = F;

    if( F )
    {
        m_ui16PDULength += EntityType::ENTITY_TYPE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityType::ENTITY_TYPE_SIZE;
    }
}